

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

bool __thiscall CDirectivePosition::Validate(CDirectivePosition *this,ValidateState *state)

{
  bool bVar1;
  int64_t iVar2;
  Architecture *pAVar3;
  
  iVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar2;
  bVar1 = Expression::evaluateInteger<long>(&this->expression,&this->position);
  if (bVar1) {
    pAVar3 = Architecture::current();
    (*pAVar3->_vptr_Architecture[3])(pAVar3);
    exec(this);
  }
  else {
    Logger::queueError<>(FatalError,"Invalid position");
  }
  return false;
}

Assistant:

bool CDirectivePosition::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (!expression.evaluateInteger(position))
	{
		Logger::queueError(Logger::FatalError, "Invalid position");
		return false;
	}

	Architecture::current().NextSection();
	exec();
	return false;
}